

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sel_d(DisasContext_conflict6 *ctx,fopcode op1,int fd,int ft,int fs)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 c2;
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  uintptr_t o;
  TCGv_i64 pTVar3;
  TCGCond cond;
  TCGv_i64 pTVar4;
  uintptr_t o_1;
  TCGv_i64 ret;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  TCGv_i64 pTVar5;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  c2 = tcg_const_i64_mips64el(tcg_ctx,0);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  pTVar1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  pTVar3 = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx);
  gen_load_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,(int)ret_00
                );
  gen_load_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,(int)ret);
  gen_load_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,(int)pTVar3
                );
  pTVar2 = ret;
  pTVar4 = pTVar3;
  pTVar5 = c2;
  if (op1 == OPC_SELNEZ_D) {
    tcg_gen_andi_i64_mips64el(tcg_ctx,ret,ret,1);
    cond = TCG_COND_NE;
  }
  else if (op1 == OPC_SELEQZ_D) {
    tcg_gen_andi_i64_mips64el(tcg_ctx,ret,ret,1);
    cond = TCG_COND_EQ;
  }
  else {
    if (op1 != OPC_SEL_D) {
      generate_exception_err(ctx,0x14,0);
      goto LAB_009962d2;
    }
    tcg_gen_andi_i64_mips64el(tcg_ctx,ret_00,ret_00,1);
    cond = TCG_COND_NE;
    pTVar2 = ret_00;
    pTVar4 = ret;
    pTVar5 = pTVar3;
  }
  tcg_gen_movcond_i64_mips64el(tcg_ctx,cond,ret_00,pTVar2,c2,pTVar4,pTVar5);
LAB_009962d2:
  gen_store_fpr64((DisasContext_conflict6 *)(ulong)ctx->hflags,(TCGv_i64)ctx->uc->tcg_ctx,
                  (int)ret_00);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_sel_d(DisasContext *ctx, enum fopcode op1, int fd, int ft,
                      int fs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1 = tcg_const_i64(tcg_ctx, 0);
    TCGv_i64 fp0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 fp1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 fp2 = tcg_temp_new_i64(tcg_ctx);
    gen_load_fpr64(ctx, fp0, fd);
    gen_load_fpr64(ctx, fp1, ft);
    gen_load_fpr64(ctx, fp2, fs);

    switch (op1) {
    case OPC_SEL_D:
        tcg_gen_andi_i64(tcg_ctx, fp0, fp0, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, fp0, fp0, t1, fp1, fp2);
        break;
    case OPC_SELEQZ_D:
        tcg_gen_andi_i64(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_EQ, fp0, fp1, t1, fp2, t1);
        break;
    case OPC_SELNEZ_D:
        tcg_gen_andi_i64(tcg_ctx, fp1, fp1, 1);
        tcg_gen_movcond_i64(tcg_ctx, TCG_COND_NE, fp0, fp1, t1, fp2, t1);
        break;
    default:
        MIPS_INVAL("gen_sel_d");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

    gen_store_fpr64(ctx, fp0, fd);
    tcg_temp_free_i64(tcg_ctx, fp2);
    tcg_temp_free_i64(tcg_ctx, fp1);
    tcg_temp_free_i64(tcg_ctx, fp0);
    tcg_temp_free_i64(tcg_ctx, t1);
}